

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

void omp_init_nest_lock_with_hint_(void **user_lock,uintptr_t *hint)

{
  int gtid;
  uintptr_t in_stack_00000058;
  void **in_stack_00000060;
  kmp_int32 in_stack_0000006c;
  ident_t *in_stack_00000070;
  
  __kmp_get_global_thread_id_reg();
  __kmpc_init_nest_lock_with_hint
            (in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058);
  return;
}

Assistant:

void FTN_STDCALL FTN_INIT_NEST_LOCK_WITH_HINT(void **user_lock,
                                              uintptr_t KMP_DEREF hint) {
#ifdef KMP_STUB
  *((kmp_stub_lock_t *)user_lock) = UNLOCKED;
#else
  int gtid = __kmp_entry_gtid();
#if OMPT_SUPPORT && OMPT_OPTIONAL
  OMPT_STORE_RETURN_ADDRESS(gtid);
#endif
  __kmpc_init_nest_lock_with_hint(NULL, gtid, user_lock, KMP_DEREF hint);
#endif
}